

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_astable(void)

{
  uint local_1c;
  int local_10;
  int local_c;
  int j;
  int i;
  
  if (rflag == '\0') {
    outline = outline + 1;
    fprintf((FILE *)output_file,"#ifdef YYDESTRUCT\nstatic ");
  }
  if (accessing_symbol == (Yshort *)0x0) {
    local_1c = 0;
  }
  else {
    local_1c = *accessing_symbol;
  }
  fprintf((FILE *)output_file,"int yyastable[] = {%39d,",(ulong)local_1c);
  local_10 = 10;
  for (local_c = 1; local_c < nstates; local_c = local_c + 1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)accessing_symbol[local_c]);
  }
  if (rflag == '\0') {
    outline = outline + 3;
  }
  fprintf((FILE *)output_file,"\n};\n");
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"#endif /* YYDESTRUCT */\n");
  }
  return;
}

Assistant:

void output_astable()
{
    register int i;
    register int j;

    if (!rflag) {
	++outline;
	fprintf(output_file, "#ifdef YYDESTRUCT\nstatic ");
    }
    fprintf(output_file, "int yyastable[] = {%39d,", accessing_symbol ?
	    accessing_symbol[0] : 0);

    j = 10;
    for (i = 1; i < nstates; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
	else
	    ++j;

	fprintf(output_file, "%5d,", accessing_symbol[i]);
    }
    if (!rflag) outline += 3;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "#endif /* YYDESTRUCT */\n");
}